

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::CXMLReaderImpl
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,IFileReadCallBack *callback,
          bool deleteCallBack)

{
  char *pcVar1;
  
  (this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader =
       (_func_int **)&PTR__CXMLReaderImpl_008cda78;
  this->TextData = (char *)0x0;
  this->P = (char *)0x0;
  this->TextBegin = (char *)0x0;
  this->TextSize = 0;
  this->CurrentNodeType = EXN_NONE;
  this->SourceFormat = ETF_ASCII;
  this->TargetFormat = ETF_ASCII;
  (this->NodeName).array = (char *)0x0;
  (this->NodeName).allocated = 1;
  (this->NodeName).used = 1;
  pcVar1 = (char *)operator_new__(1);
  (this->NodeName).array = pcVar1;
  *pcVar1 = '\0';
  (this->EmptyString).array = (char *)0x0;
  (this->EmptyString).allocated = 1;
  (this->EmptyString).used = 1;
  pcVar1 = (char *)operator_new__(1);
  (this->EmptyString).array = pcVar1;
  *pcVar1 = '\0';
  (this->SpecialCharacters).data = (string<char> *)0x0;
  (this->SpecialCharacters).allocated = 0;
  (this->SpecialCharacters).used = 0;
  (this->SpecialCharacters).free_when_destroyed = true;
  (this->SpecialCharacters).is_sorted = true;
  (this->Attributes).data = (SAttribute *)0x0;
  (this->Attributes).allocated = 0;
  (this->Attributes).used = 0;
  (this->Attributes).free_when_destroyed = true;
  (this->Attributes).is_sorted = true;
  if (callback != (IFileReadCallBack *)0x0) {
    this->TargetFormat = ETF_UTF8;
    readFile(this,callback);
    if (deleteCallBack) {
      (*callback->_vptr_IFileReadCallBack[1])(callback);
    }
    createSpecialCharacterList(this);
    this->P = this->TextBegin;
  }
  return;
}

Assistant:

CXMLReaderImpl(IFileReadCallBack* callback, bool deleteCallBack = true)
		: TextData(0), P(0), TextBegin(0), TextSize(0), CurrentNodeType(EXN_NONE),
		SourceFormat(ETF_ASCII), TargetFormat(ETF_ASCII)
	{
		if (!callback)
			return;

		storeTargetFormat();

		// read whole xml file

		readFile(callback);
		
		// clean up

		if (deleteCallBack)
			delete callback;

		// create list with special characters

		createSpecialCharacterList();

		// set pointer to text begin
		P = TextBegin;
	}